

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void SHA256_Final_Y(uchar *digest,SHA256_CTX_Y *ctx)

{
  uint uVar1;
  uchar len [8];
  
  be32enc_vect(len,ctx->count,8);
  uVar1 = ctx->count[1] >> 3 & 0x3f;
  SHA256_Update_Y(ctx,PAD,(ulong)(((uint)(0x37 < uVar1) << 6 | 0x38) - uVar1));
  SHA256_Update_Y(ctx,len,8);
  be32enc_vect(digest,ctx->state,0x20);
  ctx->buf[0x28] = '\0';
  ctx->buf[0x29] = '\0';
  ctx->buf[0x2a] = '\0';
  ctx->buf[0x2b] = '\0';
  ctx->buf[0x2c] = '\0';
  ctx->buf[0x2d] = '\0';
  ctx->buf[0x2e] = '\0';
  ctx->buf[0x2f] = '\0';
  ctx->buf[0x30] = '\0';
  ctx->buf[0x31] = '\0';
  ctx->buf[0x32] = '\0';
  ctx->buf[0x33] = '\0';
  ctx->buf[0x34] = '\0';
  ctx->buf[0x35] = '\0';
  ctx->buf[0x36] = '\0';
  ctx->buf[0x37] = '\0';
  ctx->buf[0x18] = '\0';
  ctx->buf[0x19] = '\0';
  ctx->buf[0x1a] = '\0';
  ctx->buf[0x1b] = '\0';
  ctx->buf[0x1c] = '\0';
  ctx->buf[0x1d] = '\0';
  ctx->buf[0x1e] = '\0';
  ctx->buf[0x1f] = '\0';
  ctx->buf[0x20] = '\0';
  ctx->buf[0x21] = '\0';
  ctx->buf[0x22] = '\0';
  ctx->buf[0x23] = '\0';
  ctx->buf[0x24] = '\0';
  ctx->buf[0x25] = '\0';
  ctx->buf[0x26] = '\0';
  ctx->buf[0x27] = '\0';
  ctx->buf[8] = '\0';
  ctx->buf[9] = '\0';
  ctx->buf[10] = '\0';
  ctx->buf[0xb] = '\0';
  ctx->buf[0xc] = '\0';
  ctx->buf[0xd] = '\0';
  ctx->buf[0xe] = '\0';
  ctx->buf[0xf] = '\0';
  ctx->buf[0x10] = '\0';
  ctx->buf[0x11] = '\0';
  ctx->buf[0x12] = '\0';
  ctx->buf[0x13] = '\0';
  ctx->buf[0x14] = '\0';
  ctx->buf[0x15] = '\0';
  ctx->buf[0x16] = '\0';
  ctx->buf[0x17] = '\0';
  ctx->count[0] = 0;
  ctx->count[1] = 0;
  ctx->buf[0] = '\0';
  ctx->buf[1] = '\0';
  ctx->buf[2] = '\0';
  ctx->buf[3] = '\0';
  ctx->buf[4] = '\0';
  ctx->buf[5] = '\0';
  ctx->buf[6] = '\0';
  ctx->buf[7] = '\0';
  ctx->state[4] = 0;
  ctx->state[5] = 0;
  ctx->state[6] = 0;
  ctx->state[7] = 0;
  ctx->state[0] = 0;
  ctx->state[1] = 0;
  ctx->state[2] = 0;
  ctx->state[3] = 0;
  ctx->buf[0x38] = '\0';
  ctx->buf[0x39] = '\0';
  ctx->buf[0x3a] = '\0';
  ctx->buf[0x3b] = '\0';
  ctx->buf[0x3c] = '\0';
  ctx->buf[0x3d] = '\0';
  ctx->buf[0x3e] = '\0';
  ctx->buf[0x3f] = '\0';
  return;
}

Assistant:

void
SHA256_Final_Y(unsigned char digest[32], SHA256_CTX_Y * ctx)
{

	/* Add padding */
	SHA256_Pad(ctx);

	/* Write the hash */
	be32enc_vect(digest, ctx->state, 32);

	/* Clear the context state */
	memset((void *)ctx, 0, sizeof(*ctx));
}